

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

QString * __thiscall QCommandLineParser::value(QCommandLineParser *this,QCommandLineOption *option)

{
  QCommandLineParser *in_RDX;
  QCommandLineOption *in_RSI;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QList<QString> *this_00;
  QString *optionName;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  optionName = &local_20;
  this_00 = in_RDI;
  QCommandLineOption::names(in_RSI);
  QList<QString>::constFirst(this_00);
  value(in_RDX,optionName);
  QList<QString>::~QList((QList<QString> *)0x178435);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QCommandLineParser::value(const QCommandLineOption &option) const
{
    return value(option.names().constFirst());
}